

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# welcome_message_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::WelcomeMessageTest_test_equals_different_Test::TestBody
          (WelcomeMessageTest_test_equals_different_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_c8;
  Message local_c0;
  WelcomeMessage local_b8 [24];
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_2;
  Message local_88;
  WelcomeMessage local_80 [24];
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  Message local_50 [3];
  WelcomeMessage local_38 [24];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  WelcomeMessageTest_test_equals_different_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  bidfx_public_api::price::pixie::WelcomeMessage::WelcomeMessage
            (local_38,VERSION + 1,CLIENT_ID,SERVER_ID);
  testing::internal::
  CmpHelperNE<bidfx_public_api::price::pixie::WelcomeMessage,bidfx_public_api::price::pixie::WelcomeMessage>
            ((internal *)local_20,"WELCOME_MESSAGE",
             "WelcomeMessage(VERSION + 1, CLIENT_ID, SERVER_ID)",(WelcomeMessage *)WELCOME_MESSAGE,
             local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/welcome_message_test.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  bidfx_public_api::price::pixie::WelcomeMessage::WelcomeMessage
            (local_80,VERSION,CLIENT_ID + 1,SERVER_ID);
  testing::internal::
  CmpHelperNE<bidfx_public_api::price::pixie::WelcomeMessage,bidfx_public_api::price::pixie::WelcomeMessage>
            ((internal *)local_68,"WELCOME_MESSAGE",
             "WelcomeMessage(VERSION, CLIENT_ID + 1, SERVER_ID)",(WelcomeMessage *)WELCOME_MESSAGE,
             local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/welcome_message_test.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  bidfx_public_api::price::pixie::WelcomeMessage::WelcomeMessage
            (local_b8,VERSION,CLIENT_ID,SERVER_ID + 1);
  testing::internal::
  CmpHelperNE<bidfx_public_api::price::pixie::WelcomeMessage,bidfx_public_api::price::pixie::WelcomeMessage>
            ((internal *)local_a0,"WELCOME_MESSAGE",
             "WelcomeMessage(VERSION, CLIENT_ID, SERVER_ID + 1)",(WelcomeMessage *)WELCOME_MESSAGE,
             local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/welcome_message_test.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  return;
}

Assistant:

TEST(WelcomeMessageTest, test_equals_different)
{
    EXPECT_NE(WELCOME_MESSAGE, WelcomeMessage(VERSION + 1, CLIENT_ID, SERVER_ID));
    EXPECT_NE(WELCOME_MESSAGE, WelcomeMessage(VERSION, CLIENT_ID + 1, SERVER_ID));
    EXPECT_NE(WELCOME_MESSAGE, WelcomeMessage(VERSION, CLIENT_ID, SERVER_ID + 1));
}